

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query.cc
# Opt level: O2

bool __thiscall
S2ClosestEdgeQuery::IsDistanceLessOrEqual
          (S2ClosestEdgeQuery *this,Target *target,S1ChordAngle limit)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  Result RVar4;
  Options tmp_options;
  Options local_38;
  
  uVar1 = (this->options_).super_Options.include_interiors_;
  uVar2 = (this->options_).super_Options.use_brute_force_;
  uVar3 = *(undefined2 *)&(this->options_).super_Options.field_0x16;
  local_38._22_2_ = uVar3;
  local_38.use_brute_force_ = (bool)uVar2;
  local_38.include_interiors_ = (bool)uVar1;
  local_38.max_distance_.super_S1ChordAngle.length2_ =
       (S1ChordAngle)(this->options_).super_Options.max_distance_.super_S1ChordAngle.length2_;
  local_38.max_error_.length2_ = (this->options_).super_Options.max_error_.length2_;
  local_38.max_results_ = 1;
  Options::set_inclusive_max_distance((Options *)&local_38,limit);
  local_38.max_error_.length2_ = (double)S1ChordAngle::Straight();
  RVar4 = S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdge(&this->base_,target,&local_38);
  return -1 < RVar4.shape_id_;
}

Assistant:

bool S2ClosestEdgeQuery::IsDistanceLessOrEqual(Target* target,
                                               S1ChordAngle limit) {
  static_assert(sizeof(Options) <= 32, "Consider not copying Options here");
  Options tmp_options = options_;
  tmp_options.set_max_results(1);
  tmp_options.set_inclusive_max_distance(limit);
  tmp_options.set_max_error(S1ChordAngle::Straight());
  return !base_.FindClosestEdge(target, tmp_options).is_empty();
}